

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_UTF8.h
# Opt level: O0

char * choc::text::findInvalidUTF8Data(void *dataToCheck,size_t numBytes)

{
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  int local_4c;
  int i;
  int local_3c;
  uint local_38;
  int numExtraBytes;
  int testBit;
  char byte;
  size_t offset;
  char *source;
  size_t numBytes_local;
  void *dataToCheck_local;
  
  source = (char *)numBytes;
  numBytes_local = (size_t)dataToCheck;
  soul::checkAssertion
            (dataToCheck != (void *)0x0,"dataToCheck != nullptr","findInvalidUTF8Data",0xc4);
  offset = numBytes_local;
  _testBit = (char *)0x0;
  do {
    while( true ) {
      if (source <= _testBit) {
        return (char *)0x0;
      }
      numExtraBytes._3_1_ = _testBit[offset];
      if (numExtraBytes._3_1_ < '\x01') break;
      _testBit = _testBit + 1;
    }
    if (numExtraBytes._3_1_ == '\0') {
      return (char *)0x0;
    }
    local_38 = 0x40;
    local_3c = 0;
    do {
      if (((int)numExtraBytes._3_1_ & local_38) == 0) goto LAB_003c1581;
      local_38 = (int)local_38 >> 1;
      local_3c = local_3c + 1;
      bVar2 = true;
      if (((local_3c < 4) && (bVar2 = true, _testBit + local_3c < source)) &&
         (bVar2 = false, local_3c == 3)) {
        UTF8Pointer::UTF8Pointer((UTF8Pointer *)&stack0xffffffffffffffb8,_testBit + offset);
        uVar3 = UTF8Pointer::operator*((UTF8Pointer *)&stack0xffffffffffffffb8);
        bVar2 = 0x10ffff < uVar3;
      }
    } while (!bVar2);
    local_3c = 0;
LAB_003c1581:
    if (local_3c == 0) {
      return _testBit + offset;
    }
    local_4c = 0;
    _testBit = _testBit + 1;
    while ((local_4c < local_3c &&
           (pcVar4 = _testBit + 1, pcVar1 = _testBit + offset, _testBit = pcVar4,
           ((int)*pcVar1 & 0xc0U) == 0x80))) {
      local_4c = local_4c + 1;
    }
  } while( true );
}

Assistant:

inline const char* findInvalidUTF8Data (const void* dataToCheck, size_t numBytes)
{
    CHOC_ASSERT (dataToCheck != nullptr);
    auto source = static_cast<const char*> (dataToCheck);
    size_t offset = 0;

    for (;;)
    {
        if (offset >= numBytes)
            return nullptr;

        auto byte = static_cast<signed char> (source[offset]);

        if (byte > 0)
        {
            ++offset;
            continue;
        }

        if (byte == 0)
            return nullptr;

        int testBit = 0x40, numExtraBytes = 0;

        while ((byte & testBit) != 0)
        {
            testBit >>= 1;
            ++numExtraBytes;

            if (numExtraBytes > 3
                || offset + static_cast<size_t> (numExtraBytes) >= numBytes
                || (numExtraBytes == 3 && *UTF8Pointer (source + offset) > 0x10ffff))
            {
                numExtraBytes = 0;
                break;
            }
        }

        if (numExtraBytes == 0)
            break;

        ++offset;

        for (int i = 0; i < numExtraBytes; ++i)
            if ((source[offset++] & 0xc0) != 0x80)
                break;
    }

    return source + offset;
}